

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

void print_usage(int param_1,char **argv)

{
  puts("\nexample usage:");
  printf("\n    CPU only:   %s -m ./llama-3.Q4_K_M.gguf\n",*argv);
  printf("\n    with GPU:   %s -m ./llama-3.Q4_K_M.gguf -ngl 99\n",*argv);
  printf("\n    advanced:   %s -m ./llama-3.Q4_K_M.gguf -ngl 99 --pca-iter 2000 --pca-batch 100\n",
         *argv);
  printf("\n    using mean: %s -m ./llama-3.Q4_K_M.gguf --method mean\n",*argv);
  putchar(10);
  return;
}

Assistant:

static void print_usage(int, char ** argv) {
    printf("\nexample usage:\n");
    printf("\n    CPU only:   %s -m ./llama-3.Q4_K_M.gguf\n", argv[0]);
    printf("\n    with GPU:   %s -m ./llama-3.Q4_K_M.gguf -ngl 99\n", argv[0]);
    printf("\n    advanced:   %s -m ./llama-3.Q4_K_M.gguf -ngl 99 --pca-iter 2000 --pca-batch 100\n", argv[0]);
    printf("\n    using mean: %s -m ./llama-3.Q4_K_M.gguf --method mean\n", argv[0]);
    printf("\n");
}